

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdswitch.c
# Opt level: O0

void jpeg_default_qtables(j_compress_ptr cinfo,boolean force_baseline)

{
  undefined8 in_RDI;
  uint *unaff_retaddr;
  
  jpeg_add_quant_table
            (cinfo,force_baseline,unaff_retaddr,(int)((ulong)in_RDI >> 0x20),(boolean)in_RDI);
  jpeg_add_quant_table
            (cinfo,force_baseline,unaff_retaddr,(int)((ulong)in_RDI >> 0x20),(boolean)in_RDI);
  return;
}

Assistant:

LOCAL(void)
jpeg_default_qtables(j_compress_ptr cinfo, boolean force_baseline)
{
  jpeg_add_quant_table(cinfo, 0, std_luminance_quant_tbl, q_scale_factor[0],
                       force_baseline);
  jpeg_add_quant_table(cinfo, 1, std_chrominance_quant_tbl, q_scale_factor[1],
                       force_baseline);
}